

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall
server_response::add_waiting_tasks
          (server_response *this,vector<server_task,_std::allocator<server_task>_> *tasks)

{
  uint uVar1;
  bool bVar2;
  reference psVar3;
  common_log *log;
  size_type sVar4;
  undefined8 in_RSI;
  pair<std::__detail::_Node_iterator<int,_true,_false>,_bool> pVar5;
  server_task *task;
  const_iterator __end1;
  const_iterator __begin1;
  vector<server_task,_std::allocator<server_task>_> *__range1;
  unique_lock<std::mutex> lock;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  unique_lock<std::mutex> *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  _Node_iterator_base<int,_false> in_stack_ffffffffffffff80;
  __normal_iterator<const_server_task_*,_std::vector<server_task,_std::allocator<server_task>_>_>
  local_30;
  undefined8 local_28;
  undefined8 local_10;
  
  local_10 = in_RSI;
  httplib::detail::std::unique_lock<std::mutex>::unique_lock
            (in_stack_ffffffffffffff70,
             (mutex_type *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  local_28 = local_10;
  local_30._M_current =
       (server_task *)
       httplib::detail::std::vector<server_task,_std::allocator<server_task>_>::begin
                 ((vector<server_task,_std::allocator<server_task>_> *)
                  CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  httplib::detail::std::vector<server_task,_std::allocator<server_task>_>::end
            ((vector<server_task,_std::allocator<server_task>_> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_server_task_*,_std::vector<server_task,_std::allocator<server_task>_>_>
                        *)in_stack_ffffffffffffff70,
                       (__normal_iterator<const_server_task_*,_std::vector<server_task,_std::allocator<server_task>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (!bVar2) break;
    psVar3 = __gnu_cxx::
             __normal_iterator<const_server_task_*,_std::vector<server_task,_std::allocator<server_task>_>_>
             ::operator*(&local_30);
    if (0 < common_log_verbosity_thold) {
      log = common_log_main();
      uVar1 = psVar3->id;
      sVar4 = httplib::detail::std::
              unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::size
                        ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                          *)0x282049);
      in_stack_ffffffffffffff68 = (undefined4)sVar4;
      common_log_add(log,GGML_LOG_LEVEL_DEBUG,
                     "srv  %12.*s: add task %d to waiting list. current waiting = %d (before add)\n"
                     ,0xc,"add_waiting_tasks",(ulong)uVar1);
    }
    pVar5 = httplib::detail::std::
            unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::insert
                      ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                        *)in_stack_ffffffffffffff80._M_cur,
                       (value_type *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    in_stack_ffffffffffffff80._M_cur =
         (__node_type *)pVar5.first.super__Node_iterator_base<int,_false>._M_cur;
    in_stack_ffffffffffffff7f = pVar5.second;
    __gnu_cxx::
    __normal_iterator<const_server_task_*,_std::vector<server_task,_std::allocator<server_task>_>_>
    ::operator++(&local_30);
  }
  httplib::detail::std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffff70);
  return;
}

Assistant:

void add_waiting_tasks(const std::vector<server_task> & tasks) {
        std::unique_lock<std::mutex> lock(mutex_results);

        for (const auto & task : tasks) {
            SRV_DBG("add task %d to waiting list. current waiting = %d (before add)\n", task.id, (int) waiting_task_ids.size());
            waiting_task_ids.insert(task.id);
        }
    }